

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::LiteTest_AllLite1_Test<absl::lts_20250127::Cord>::TestBody
          (LiteTest_AllLite1_Test<absl::lts_20250127::Cord> *this)

{
  undefined1 local_a08 [8];
  TypeParam data;
  TestAllTypesLite message3;
  undefined1 local_6a0 [8];
  TestAllTypesLite message2;
  TestAllTypesLite message;
  LiteTest_AllLite1_Test<absl::lts_20250127::Cord> *this_local;
  
  proto2_unittest::TestAllTypesLite::TestAllTypesLite
            ((TestAllTypesLite *)((long)&message2.field_0 + 0x330));
  proto2_unittest::TestAllTypesLite::TestAllTypesLite((TestAllTypesLite *)local_6a0);
  proto2_unittest::TestAllTypesLite::TestAllTypesLite
            ((TestAllTypesLite *)((long)&data.contents_.data_.rep_.field_0 + 8));
  TestUtilLite::ExpectClear((TestAllTypesLite *)((long)&message2.field_0 + 0x330));
  TestUtilLite::SetAllFields((TestAllTypesLite *)((long)&message2.field_0 + 0x330));
  proto2_unittest::TestAllTypesLite::operator=
            ((TestAllTypesLite *)local_6a0,(TestAllTypesLite *)((long)&message2.field_0 + 0x330));
  SerializeAs<absl::lts_20250127::Cord>((MessageLite *)local_a08);
  ParseFrom((Cord *)local_a08,(MessageLite *)((long)&data.contents_.data_.rep_.field_0 + 8));
  TestUtilLite::ExpectAllFieldsSet((TestAllTypesLite *)((long)&message2.field_0 + 0x330));
  TestUtilLite::ExpectAllFieldsSet((TestAllTypesLite *)local_6a0);
  TestUtilLite::ExpectAllFieldsSet
            ((TestAllTypesLite *)((long)&data.contents_.data_.rep_.field_0 + 8));
  TestUtilLite::ModifyRepeatedFields((TestAllTypesLite *)((long)&message2.field_0 + 0x330));
  TestUtilLite::ExpectRepeatedFieldsModified((TestAllTypesLite *)((long)&message2.field_0 + 0x330));
  proto2_unittest::TestAllTypesLite::Clear((TestAllTypesLite *)((long)&message2.field_0 + 0x330));
  TestUtilLite::ExpectClear((TestAllTypesLite *)((long)&message2.field_0 + 0x330));
  absl::lts_20250127::Cord::~Cord((Cord *)local_a08);
  proto2_unittest::TestAllTypesLite::~TestAllTypesLite
            ((TestAllTypesLite *)((long)&data.contents_.data_.rep_.field_0 + 8));
  proto2_unittest::TestAllTypesLite::~TestAllTypesLite((TestAllTypesLite *)local_6a0);
  proto2_unittest::TestAllTypesLite::~TestAllTypesLite
            ((TestAllTypesLite *)((long)&message2.field_0 + 0x330));
  return;
}

Assistant:

TYPED_TEST(LiteTest, AllLite1) {
  {
    proto2_unittest::TestAllTypesLite message, message2, message3;
    TestUtilLite::ExpectClear(message);
    TestUtilLite::SetAllFields(&message);
    message2 = message;
    TypeParam data = SerializeAs<TypeParam>(message2);
    ParseFrom(data, message3);
    TestUtilLite::ExpectAllFieldsSet(message);
    TestUtilLite::ExpectAllFieldsSet(message2);
    TestUtilLite::ExpectAllFieldsSet(message3);
    TestUtilLite::ModifyRepeatedFields(&message);
    TestUtilLite::ExpectRepeatedFieldsModified(message);
    message.Clear();
    TestUtilLite::ExpectClear(message);
  }
}